

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.h
# Opt level: O3

float parseFloat(char *p,char **end,char *endLine)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  byte *pbVar5;
  int iVar6;
  byte *pbVar7;
  int iVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  
  pcVar4 = p;
  if (*p == '\0') {
    *end = p;
    return 0.0;
  }
  do {
    cVar1 = *pcVar4;
    bVar9 = pcVar4 < endLine;
    pcVar4 = pcVar4 + 1;
    if (cVar1 != ' ') break;
  } while (endLine == (char *)0x0 || bVar9);
  pbVar7 = (byte *)(pcVar4 + ((ulong)(cVar1 == '-') - 1));
  bVar2 = *pbVar7;
  fVar14 = 0.0;
  if ((endLine == (char *)0x0 || pbVar7 < endLine) && ((byte)(bVar2 - 0x30) < 10)) {
    pbVar5 = (byte *)(pcVar4 + (cVar1 == '-'));
    do {
      pbVar7 = pbVar7 + 1;
      fVar14 = fVar14 * 10.0 + (float)bVar2 + -48.0;
      bVar2 = *pbVar5;
      if (endLine != (char *)0x0 && endLine <= pbVar5) break;
      pbVar5 = pbVar5 + 1;
    } while ((byte)(bVar2 - 0x30) < 10);
  }
  pbVar5 = pbVar7;
  if (bVar2 == 0x2e) {
    bVar2 = pbVar7[1];
    pbVar5 = pbVar7 + 1;
    if ((pbVar7 + 1 < endLine || endLine == (char *)0x0) && (byte)(bVar2 - 0x30) < 10) {
      iVar3 = 0;
      pbVar7 = pbVar7 + 2;
      do {
        pbVar5 = pbVar7;
        if (iVar3 < 0x23) {
          fVar14 = fVar14 * 10.0 + (float)(int)(char)(bVar2 - 0x30);
          iVar3 = iVar3 + 1;
        }
        bVar2 = *pbVar5;
      } while ((endLine == (char *)0x0 || pbVar5 < endLine) &&
              (pbVar7 = pbVar5 + 1, (byte)(bVar2 - 0x30) < 10));
      goto LAB_00141673;
    }
  }
  iVar3 = 0;
LAB_00141673:
  pbVar7 = pbVar5;
  iVar6 = 0;
  if (((bVar2 | 0x20) == 0x65) && ((endLine == (char *)0x0 || (pbVar5 < endLine)))) {
    bVar10 = endLine == (char *)0x0;
    bVar11 = pbVar5[1] == 0x2d;
    bVar9 = pbVar5 + 1 < endLine;
    pbVar7 = pbVar5 + 2;
    if (!bVar9 && !bVar10 || !bVar11) {
      pbVar7 = pbVar5 + 1;
    }
    bVar2 = pbVar5[(ulong)((bVar9 || bVar10) && bVar11) + 1];
    iVar8 = 0;
    if ((bVar10 || pbVar7 < endLine) && (iVar8 = 0, (byte)(bVar2 - 0x30) < 10)) {
      iVar8 = 0;
      do {
        pbVar7 = pbVar7 + 1;
        iVar8 = (uint)bVar2 + iVar8 * 10 + -0x30;
        bVar2 = *pbVar7;
        if (endLine != (char *)0x0 && endLine <= pbVar7) break;
      } while ((byte)(bVar2 - 0x30) < 10);
    }
    iVar6 = -iVar8;
    if (!bVar9 && !bVar10 || !bVar11) {
      iVar6 = iVar8;
    }
  }
  if (((bVar2 < 0x21) && ((0x100000600U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
     (pbVar7 == (byte *)endLine)) {
    fVar12 = powf(10.0,(float)(iVar6 - iVar3));
    fVar14 = fVar14 * fVar12;
    *end = (char *)pbVar7;
    if (cVar1 == '-') {
      fVar14 = -fVar14;
    }
  }
  else {
    dVar13 = strtod(p,end);
    fVar14 = (float)dVar13;
  }
  return fVar14;
}

Assistant:

inline float parseFloat(char* p, char** end, char* endLine = nullptr)
{
  char* start = p;
  bool endLine_is_null = endLine == nullptr;

  if (!*p)
  {
    *end = p;
    return 0;
  }
  int s = 1;
  while ((*p == ' ') && (endLine_is_null || p < endLine)) p++;

  if (*p == '-')
  {
    s = -1;
    p++;
  }

  float acc = 0;
  while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) acc = acc * 10 + *p++ - '0';

  int num_dec = 0;
  if (*p == '.')
  {
    while (*(++p) >= '0' && *p <= '9' && (endLine_is_null || p < endLine))
    {
      if (num_dec < 35)
      {
        acc = acc * 10 + (*p - '0');
        num_dec++;
      }
    }
  }

  int exp_acc = 0;
  if ((*p == 'e' || *p == 'E') && (endLine_is_null || p < endLine))
  {
    p++;
    int exp_s = 1;
    if (*p == '-' && (endLine_is_null || p < endLine))
    {
      exp_s = -1;
      p++;
    }
    while (*p >= '0' && *p <= '9' && (endLine_is_null || p < endLine)) exp_acc = exp_acc * 10 + *p++ - '0';
    exp_acc *= exp_s;
  }
  if (*p == ' ' || *p == '\n' || *p == '\t' || p == endLine)  // easy case succeeded.
  {
    acc *= powf(10, (float)(exp_acc - num_dec));
    *end = p;
    return s * acc;
  }
  else
    return (float)strtod(start, end);
}